

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_jit_compile.c
# Opt level: O0

void compile_matchingpath
               (compiler_common *common,PCRE2_SPTR16 cc,PCRE2_SPTR16 ccend,backtrack_common *parent)

{
  sljit_compiler *compiler_00;
  bool bVar1;
  sljit_s32 sVar2;
  backtrack_common *pbVar3;
  assert_backtrack *paVar4;
  backtrack_common *pbVar5;
  int iVar6;
  jump_list **local_158;
  jump_list **local_140;
  jump_list **local_128;
  jump_list **local_110;
  jump_list **local_f0;
  jump_list **local_d0;
  jump_list **local_b0;
  jump_list **local_90;
  jump_list **local_70;
  then_trap_backtrack *local_48;
  then_trap_backtrack *save_then_trap;
  BOOL has_then_trap;
  backtrack_common *backtrack;
  sljit_compiler *compiler;
  backtrack_common *parent_local;
  PCRE2_SPTR16 ccend_local;
  PCRE2_SPTR16 cc_local;
  compiler_common *common_local;
  
  compiler_00 = common->compiler;
  bVar1 = false;
  local_48 = (then_trap_backtrack *)0x0;
  ccend_local = cc;
  if ((common->has_then != 0) && (common->then_offsets[(long)cc - (long)common->start >> 1] != '\0')
     ) {
    bVar1 = true;
    local_48 = common->then_trap;
    compile_then_trap_matchingpath(common,cc,ccend,parent);
  }
  do {
    if (ccend <= ccend_local) {
      if (!bVar1) {
        return;
      }
      pbVar5 = (backtrack_common *)sljit_alloc_memory(compiler_00,0x48);
      sVar2 = sljit_get_compiler_error(compiler_00);
      if (sVar2 != 0) {
        return;
      }
      memset(pbVar5,0,0x48);
      pbVar5->prev = parent->top;
      pbVar5->cc = ccend_local;
      parent->top = pbVar5;
      pbVar5->cc = then_trap_opcode;
      pbVar5[1].prev = &common->then_trap->common;
      common->then_trap = local_48;
      return;
    }
    switch(*ccend_local) {
    case 1:
    case 2:
    case 4:
    case 5:
    case 0x17:
    case 0x18:
    case 0x19:
    case 0x1a:
    case 0x1b:
    case 0x1c:
    case 0x7d:
      if (parent->top == (backtrack_common *)0x0) {
        local_70 = &parent->topbacktracks;
      }
      else {
        local_70 = &parent->top->nextbacktracks;
      }
      ccend_local = compile_simple_assertion_matchingpath
                              (common,*ccend_local,ccend_local + 1,local_70);
      break;
    case 3:
      pbVar5 = (backtrack_common *)sljit_alloc_memory(compiler_00,0x28);
      sVar2 = sljit_get_compiler_error(compiler_00);
      if (sVar2 != 0) {
        return;
      }
      memset(pbVar5,0,0x28);
      pbVar5->prev = parent->top;
      pbVar5->cc = ccend_local;
      parent->top = pbVar5;
      sljit_emit_op1(compiler_00,0x20,4,0,0x8e,(long)common->ovector_start);
      allocate_stack(common,1);
      sljit_emit_op1(compiler_00,0x20,0x8e,(long)common->ovector_start,2,0);
      sljit_emit_op1(compiler_00,0x20,0x8c,0,4,0);
      ccend_local = ccend_local + 1;
      break;
    case 6:
    case 7:
    case 8:
    case 9:
    case 10:
    case 0xb:
    case 0xc:
    case 0xd:
    case 0xe:
    case 0xf:
    case 0x10:
    case 0x11:
    case 0x12:
    case 0x13:
    case 0x14:
    case 0x15:
    case 0x16:
    case 0x1f:
    case 0x20:
      if (parent->top == (backtrack_common *)0x0) {
        local_90 = &parent->topbacktracks;
      }
      else {
        local_90 = &parent->top->nextbacktracks;
      }
      ccend_local = compile_char1_matchingpath(common,*ccend_local,ccend_local + 1,local_90,1);
      break;
    case 0x1d:
    case 0x1e:
      if (common->mode == 1) {
        if (parent->top == (backtrack_common *)0x0) {
          local_b0 = &parent->topbacktracks;
        }
        else {
          local_b0 = &parent->top->nextbacktracks;
        }
        ccend_local = compile_charn_matchingpath(common,ccend_local,ccend,local_b0);
      }
      else {
        if (parent->top == (backtrack_common *)0x0) {
          local_d0 = &parent->topbacktracks;
        }
        else {
          local_d0 = &parent->top->nextbacktracks;
        }
        ccend_local = compile_char1_matchingpath(common,*ccend_local,ccend_local + 1,local_d0,1);
      }
      break;
    case 0x21:
    case 0x22:
    case 0x23:
    case 0x24:
    case 0x25:
    case 0x26:
    case 0x27:
    case 0x28:
    case 0x29:
    case 0x2a:
    case 0x2b:
    case 0x2c:
    case 0x2d:
    case 0x2e:
    case 0x2f:
    case 0x30:
    case 0x31:
    case 0x32:
    case 0x33:
    case 0x34:
    case 0x35:
    case 0x36:
    case 0x37:
    case 0x38:
    case 0x39:
    case 0x3a:
    case 0x3b:
    case 0x3c:
    case 0x3d:
    case 0x3e:
    case 0x3f:
    case 0x40:
    case 0x41:
    case 0x42:
    case 0x43:
    case 0x44:
    case 0x45:
    case 0x46:
    case 0x47:
    case 0x48:
    case 0x49:
    case 0x4a:
    case 0x4b:
    case 0x4c:
    case 0x4d:
    case 0x4e:
    case 0x4f:
    case 0x50:
    case 0x51:
    case 0x52:
    case 0x53:
    case 0x54:
    case 0x55:
    case 0x56:
    case 0x57:
    case 0x58:
    case 0x59:
    case 0x5a:
    case 0x5b:
    case 0x5c:
    case 0x5d:
    case 0x5e:
    case 0x5f:
    case 0x60:
    case 0x61:
      ccend_local = compile_iterator_matchingpath(common,ccend_local,parent);
      break;
    default:
      return;
    case 0x6e:
    case 0x6f:
      if ((ccend_local[0x11] < 0x62) || (0x6d < ccend_local[0x11])) {
        if (parent->top == (backtrack_common *)0x0) {
          local_f0 = &parent->topbacktracks;
        }
        else {
          local_f0 = &parent->top->nextbacktracks;
        }
        ccend_local = compile_char1_matchingpath(common,*ccend_local,ccend_local + 1,local_f0,1);
      }
      else {
        ccend_local = compile_iterator_matchingpath(common,ccend_local,parent);
      }
      break;
    case 0x70:
      if ((ccend_local[(int)(uint)ccend_local[1]] < 0x62) ||
         (0x6d < ccend_local[(int)(uint)ccend_local[1]])) {
        if (parent->top == (backtrack_common *)0x0) {
          local_110 = &parent->topbacktracks;
        }
        else {
          local_110 = &parent->top->nextbacktracks;
        }
        ccend_local = compile_char1_matchingpath(common,*ccend_local,ccend_local + 1,local_110,1);
      }
      else {
        ccend_local = compile_iterator_matchingpath(common,ccend_local,parent);
      }
      break;
    case 0x71:
    case 0x72:
      if ((ccend_local[2] < 0x62) || (0x6d < ccend_local[2])) {
        if (parent->top == (backtrack_common *)0x0) {
          local_128 = &parent->topbacktracks;
        }
        else {
          local_128 = &parent->top->nextbacktracks;
        }
        compile_ref_matchingpath(common,ccend_local,local_128,1,0);
        ccend_local = ccend_local + 2;
      }
      else {
        ccend_local = compile_ref_iterator_matchingpath(common,ccend_local,parent);
      }
      break;
    case 0x73:
    case 0x74:
      if ((ccend_local[3] < 0x62) || (0x6d < ccend_local[3])) {
        if (parent->top == (backtrack_common *)0x0) {
          local_140 = &parent->topbacktracks;
        }
        else {
          local_140 = &parent->top->nextbacktracks;
        }
        compile_dnref_search(common,ccend_local,local_140);
        if (parent->top == (backtrack_common *)0x0) {
          local_158 = &parent->topbacktracks;
        }
        else {
          local_158 = &parent->top->nextbacktracks;
        }
        compile_ref_matchingpath(common,ccend_local,local_158,1,0);
        ccend_local = ccend_local + 3;
      }
      else {
        ccend_local = compile_ref_iterator_matchingpath(common,ccend_local,parent);
      }
      break;
    case 0x75:
      ccend_local = compile_recurse_matchingpath(common,ccend_local,parent);
      break;
    case 0x76:
    case 0x77:
      ccend_local = compile_callout_matchingpath(common,ccend_local,parent);
      break;
    case 0x7e:
    case 0x7f:
    case 0x80:
    case 0x81:
      paVar4 = (assert_backtrack *)sljit_alloc_memory(compiler_00,0x40);
      sVar2 = sljit_get_compiler_error(compiler_00);
      if (sVar2 != 0) {
        return;
      }
      memset(paVar4,0,0x40);
      (paVar4->common).prev = parent->top;
      (paVar4->common).cc = ccend_local;
      parent->top = (backtrack_common *)paVar4;
      ccend_local = compile_assert_matchingpath(common,ccend_local,paVar4,0);
      break;
    case 0x82:
    case 0x83:
    case 0x85:
    case 0x87:
    case 0x88:
    case 0x8a:
    case 0x8c:
      ccend_local = compile_bracket_matchingpath(common,ccend_local,parent);
      break;
    case 0x84:
    case 0x86:
    case 0x89:
    case 0x8b:
    case 0x95:
      ccend_local = compile_bracketpos_matchingpath(common,ccend_local,parent);
      break;
    case 0x93:
      if (ccend_local[1] < 0x82) {
        paVar4 = (assert_backtrack *)sljit_alloc_memory(compiler_00,0x40);
        sVar2 = sljit_get_compiler_error(compiler_00);
        if (sVar2 != 0) {
          return;
        }
        memset(paVar4,0,0x40);
        (paVar4->common).prev = parent->top;
        (paVar4->common).cc = ccend_local;
        parent->top = (backtrack_common *)paVar4;
        ccend_local = compile_assert_matchingpath(common,ccend_local,paVar4,0);
      }
      else {
        ccend_local = compile_bracket_matchingpath(common,ccend_local,parent);
      }
      break;
    case 0x94:
      pbVar5 = (backtrack_common *)sljit_alloc_memory(compiler_00,0x30);
      sVar2 = sljit_get_compiler_error(compiler_00);
      if (sVar2 != 0) {
        return;
      }
      memset(pbVar5,0,0x30);
      pbVar5->prev = parent->top;
      pbVar5->cc = ccend_local;
      parent->top = pbVar5;
      ccend_local = bracketend(ccend_local + 1);
      if (ccend_local[-2] == 0x7b) {
        allocate_stack(common,2);
        sljit_emit_op1(compiler_00,0x20,0x8c,0,0x40,0);
        sljit_emit_op1(compiler_00,0x20,0x8c,8,2,0);
      }
      else {
        allocate_stack(common,1);
        sljit_emit_op1(compiler_00,0x20,0x8c,0,2,0);
      }
      pbVar3 = (backtrack_common *)sljit_emit_label(compiler_00);
      pbVar5[1].prev = pbVar3;
      count_match(common);
      break;
    case 0x96:
      pbVar5 = (backtrack_common *)sljit_alloc_memory(compiler_00,0x28);
      sVar2 = sljit_get_compiler_error(compiler_00);
      if (sVar2 != 0) {
        return;
      }
      memset(pbVar5,0,0x28);
      pbVar5->prev = parent->top;
      pbVar5->cc = ccend_local;
      parent->top = pbVar5;
      sljit_emit_op1(compiler_00,0x20,4,0,0x8e,(long)common->mark_ptr);
      iVar6 = 1;
      if (common->has_skip_arg != 0) {
        iVar6 = 5;
      }
      allocate_stack(common,iVar6);
      sljit_emit_op1(compiler_00,0x20,1,0,9,0);
      iVar6 = 0;
      if (common->has_skip_arg != 0) {
        iVar6 = 4;
      }
      sljit_emit_op1(compiler_00,0x20,0x8c,(long)(iVar6 << 3),4,0);
      sljit_emit_op1(compiler_00,0x20,4,0,0x40,(sljit_sw)(ccend_local + 2));
      sljit_emit_op1(compiler_00,0x20,0x8e,(long)common->mark_ptr,4,0);
      sljit_emit_op1(compiler_00,0x20,0x81,0x30,4,0);
      if (common->has_skip_arg != 0) {
        sljit_emit_op1(compiler_00,0x20,1,0,0x8e,(long)common->control_head_ptr);
        sljit_emit_op1(compiler_00,0x20,0x8e,(long)common->control_head_ptr,0xc,0);
        sljit_emit_op1(compiler_00,0x20,0x8c,8,0x40,0);
        sljit_emit_op1(compiler_00,0x20,0x8c,0x10,0x40,(sljit_sw)(ccend_local + 2));
        sljit_emit_op1(compiler_00,0x20,0x8c,0x18,2,0);
        sljit_emit_op1(compiler_00,0x20,0x8c,0,1,0);
      }
      ccend_local = ccend_local + (int)(ccend_local[1] + 3);
      break;
    case 0x97:
    case 0x98:
    case 0x99:
    case 0x9a:
    case 0x9b:
    case 0x9c:
    case 0x9d:
    case 0x9e:
      ccend_local = compile_control_verb_matchingpath(common,ccend_local,parent);
      break;
    case 0x9f:
    case 0xa0:
    case 0xa1:
      ccend_local = compile_fail_accept_matchingpath(common,ccend_local,parent);
      break;
    case 0xa2:
      ccend_local = compile_close_matchingpath(common,ccend_local);
      break;
    case 0xa3:
      ccend_local = bracketend(ccend_local + 1);
    }
  } while (ccend_local != (PCRE2_SPTR16)0x0);
  return;
}

Assistant:

static void compile_matchingpath(compiler_common *common, PCRE2_SPTR cc, PCRE2_SPTR ccend, backtrack_common *parent)
{
DEFINE_COMPILER;
backtrack_common *backtrack;
BOOL has_then_trap = FALSE;
then_trap_backtrack *save_then_trap = NULL;

SLJIT_ASSERT(*ccend == OP_END || (*ccend >= OP_ALT && *ccend <= OP_KETRPOS));

if (common->has_then && common->then_offsets[cc - common->start] != 0)
  {
  SLJIT_ASSERT(*ccend != OP_END && common->control_head_ptr != 0);
  has_then_trap = TRUE;
  save_then_trap = common->then_trap;
  /* Tail item on backtrack. */
  compile_then_trap_matchingpath(common, cc, ccend, parent);
  }

while (cc < ccend)
  {
  switch(*cc)
    {
    case OP_SOD:
    case OP_SOM:
    case OP_NOT_WORD_BOUNDARY:
    case OP_WORD_BOUNDARY:
    case OP_EODN:
    case OP_EOD:
    case OP_DOLL:
    case OP_DOLLM:
    case OP_CIRC:
    case OP_CIRCM:
    case OP_REVERSE:
    cc = compile_simple_assertion_matchingpath(common, *cc, cc + 1, parent->top != NULL ? &parent->top->nextbacktracks : &parent->topbacktracks);
    break;

    case OP_NOT_DIGIT:
    case OP_DIGIT:
    case OP_NOT_WHITESPACE:
    case OP_WHITESPACE:
    case OP_NOT_WORDCHAR:
    case OP_WORDCHAR:
    case OP_ANY:
    case OP_ALLANY:
    case OP_ANYBYTE:
    case OP_NOTPROP:
    case OP_PROP:
    case OP_ANYNL:
    case OP_NOT_HSPACE:
    case OP_HSPACE:
    case OP_NOT_VSPACE:
    case OP_VSPACE:
    case OP_EXTUNI:
    case OP_NOT:
    case OP_NOTI:
    cc = compile_char1_matchingpath(common, *cc, cc + 1, parent->top != NULL ? &parent->top->nextbacktracks : &parent->topbacktracks, TRUE);
    break;

    case OP_SET_SOM:
    PUSH_BACKTRACK_NOVALUE(sizeof(backtrack_common), cc);
    OP1(SLJIT_MOV, TMP2, 0, SLJIT_MEM1(SLJIT_SP), OVECTOR(0));
    allocate_stack(common, 1);
    OP1(SLJIT_MOV, SLJIT_MEM1(SLJIT_SP), OVECTOR(0), STR_PTR, 0);
    OP1(SLJIT_MOV, SLJIT_MEM1(STACK_TOP), STACK(0), TMP2, 0);
    cc++;
    break;

    case OP_CHAR:
    case OP_CHARI:
    if (common->mode == PCRE2_JIT_COMPLETE)
      cc = compile_charn_matchingpath(common, cc, ccend, parent->top != NULL ? &parent->top->nextbacktracks : &parent->topbacktracks);
    else
      cc = compile_char1_matchingpath(common, *cc, cc + 1, parent->top != NULL ? &parent->top->nextbacktracks : &parent->topbacktracks, TRUE);
    break;

    case OP_STAR:
    case OP_MINSTAR:
    case OP_PLUS:
    case OP_MINPLUS:
    case OP_QUERY:
    case OP_MINQUERY:
    case OP_UPTO:
    case OP_MINUPTO:
    case OP_EXACT:
    case OP_POSSTAR:
    case OP_POSPLUS:
    case OP_POSQUERY:
    case OP_POSUPTO:
    case OP_STARI:
    case OP_MINSTARI:
    case OP_PLUSI:
    case OP_MINPLUSI:
    case OP_QUERYI:
    case OP_MINQUERYI:
    case OP_UPTOI:
    case OP_MINUPTOI:
    case OP_EXACTI:
    case OP_POSSTARI:
    case OP_POSPLUSI:
    case OP_POSQUERYI:
    case OP_POSUPTOI:
    case OP_NOTSTAR:
    case OP_NOTMINSTAR:
    case OP_NOTPLUS:
    case OP_NOTMINPLUS:
    case OP_NOTQUERY:
    case OP_NOTMINQUERY:
    case OP_NOTUPTO:
    case OP_NOTMINUPTO:
    case OP_NOTEXACT:
    case OP_NOTPOSSTAR:
    case OP_NOTPOSPLUS:
    case OP_NOTPOSQUERY:
    case OP_NOTPOSUPTO:
    case OP_NOTSTARI:
    case OP_NOTMINSTARI:
    case OP_NOTPLUSI:
    case OP_NOTMINPLUSI:
    case OP_NOTQUERYI:
    case OP_NOTMINQUERYI:
    case OP_NOTUPTOI:
    case OP_NOTMINUPTOI:
    case OP_NOTEXACTI:
    case OP_NOTPOSSTARI:
    case OP_NOTPOSPLUSI:
    case OP_NOTPOSQUERYI:
    case OP_NOTPOSUPTOI:
    case OP_TYPESTAR:
    case OP_TYPEMINSTAR:
    case OP_TYPEPLUS:
    case OP_TYPEMINPLUS:
    case OP_TYPEQUERY:
    case OP_TYPEMINQUERY:
    case OP_TYPEUPTO:
    case OP_TYPEMINUPTO:
    case OP_TYPEEXACT:
    case OP_TYPEPOSSTAR:
    case OP_TYPEPOSPLUS:
    case OP_TYPEPOSQUERY:
    case OP_TYPEPOSUPTO:
    cc = compile_iterator_matchingpath(common, cc, parent);
    break;

    case OP_CLASS:
    case OP_NCLASS:
    if (cc[1 + (32 / sizeof(PCRE2_UCHAR))] >= OP_CRSTAR && cc[1 + (32 / sizeof(PCRE2_UCHAR))] <= OP_CRPOSRANGE)
      cc = compile_iterator_matchingpath(common, cc, parent);
    else
      cc = compile_char1_matchingpath(common, *cc, cc + 1, parent->top != NULL ? &parent->top->nextbacktracks : &parent->topbacktracks, TRUE);
    break;

#if defined SUPPORT_UNICODE || PCRE2_CODE_UNIT_WIDTH == 16 || PCRE2_CODE_UNIT_WIDTH == 32
    case OP_XCLASS:
    if (*(cc + GET(cc, 1)) >= OP_CRSTAR && *(cc + GET(cc, 1)) <= OP_CRPOSRANGE)
      cc = compile_iterator_matchingpath(common, cc, parent);
    else
      cc = compile_char1_matchingpath(common, *cc, cc + 1, parent->top != NULL ? &parent->top->nextbacktracks : &parent->topbacktracks, TRUE);
    break;
#endif

    case OP_REF:
    case OP_REFI:
    if (cc[1 + IMM2_SIZE] >= OP_CRSTAR && cc[1 + IMM2_SIZE] <= OP_CRPOSRANGE)
      cc = compile_ref_iterator_matchingpath(common, cc, parent);
    else
      {
      compile_ref_matchingpath(common, cc, parent->top != NULL ? &parent->top->nextbacktracks : &parent->topbacktracks, TRUE, FALSE);
      cc += 1 + IMM2_SIZE;
      }
    break;

    case OP_DNREF:
    case OP_DNREFI:
    if (cc[1 + 2 * IMM2_SIZE] >= OP_CRSTAR && cc[1 + 2 * IMM2_SIZE] <= OP_CRPOSRANGE)
      cc = compile_ref_iterator_matchingpath(common, cc, parent);
    else
      {
      compile_dnref_search(common, cc, parent->top != NULL ? &parent->top->nextbacktracks : &parent->topbacktracks);
      compile_ref_matchingpath(common, cc, parent->top != NULL ? &parent->top->nextbacktracks : &parent->topbacktracks, TRUE, FALSE);
      cc += 1 + 2 * IMM2_SIZE;
      }
    break;

    case OP_RECURSE:
    cc = compile_recurse_matchingpath(common, cc, parent);
    break;

    case OP_CALLOUT:
    case OP_CALLOUT_STR:
    cc = compile_callout_matchingpath(common, cc, parent);
    break;

    case OP_ASSERT:
    case OP_ASSERT_NOT:
    case OP_ASSERTBACK:
    case OP_ASSERTBACK_NOT:
    PUSH_BACKTRACK_NOVALUE(sizeof(assert_backtrack), cc);
    cc = compile_assert_matchingpath(common, cc, BACKTRACK_AS(assert_backtrack), FALSE);
    break;

    case OP_BRAMINZERO:
    PUSH_BACKTRACK_NOVALUE(sizeof(braminzero_backtrack), cc);
    cc = bracketend(cc + 1);
    if (*(cc - 1 - LINK_SIZE) != OP_KETRMIN)
      {
      allocate_stack(common, 1);
      OP1(SLJIT_MOV, SLJIT_MEM1(STACK_TOP), STACK(0), STR_PTR, 0);
      }
    else
      {
      allocate_stack(common, 2);
      OP1(SLJIT_MOV, SLJIT_MEM1(STACK_TOP), STACK(0), SLJIT_IMM, 0);
      OP1(SLJIT_MOV, SLJIT_MEM1(STACK_TOP), STACK(1), STR_PTR, 0);
      }
    BACKTRACK_AS(braminzero_backtrack)->matchingpath = LABEL();
    count_match(common);
    break;

    case OP_ONCE:
    case OP_BRA:
    case OP_CBRA:
    case OP_COND:
    case OP_SBRA:
    case OP_SCBRA:
    case OP_SCOND:
    cc = compile_bracket_matchingpath(common, cc, parent);
    break;

    case OP_BRAZERO:
    if (cc[1] > OP_ASSERTBACK_NOT)
      cc = compile_bracket_matchingpath(common, cc, parent);
    else
      {
      PUSH_BACKTRACK_NOVALUE(sizeof(assert_backtrack), cc);
      cc = compile_assert_matchingpath(common, cc, BACKTRACK_AS(assert_backtrack), FALSE);
      }
    break;

    case OP_BRAPOS:
    case OP_CBRAPOS:
    case OP_SBRAPOS:
    case OP_SCBRAPOS:
    case OP_BRAPOSZERO:
    cc = compile_bracketpos_matchingpath(common, cc, parent);
    break;

    case OP_MARK:
    PUSH_BACKTRACK_NOVALUE(sizeof(backtrack_common), cc);
    SLJIT_ASSERT(common->mark_ptr != 0);
    OP1(SLJIT_MOV, TMP2, 0, SLJIT_MEM1(SLJIT_SP), common->mark_ptr);
    allocate_stack(common, common->has_skip_arg ? 5 : 1);
    OP1(SLJIT_MOV, TMP1, 0, ARGUMENTS, 0);
    OP1(SLJIT_MOV, SLJIT_MEM1(STACK_TOP), STACK(common->has_skip_arg ? 4 : 0), TMP2, 0);
    OP1(SLJIT_MOV, TMP2, 0, SLJIT_IMM, (sljit_sw)(cc + 2));
    OP1(SLJIT_MOV, SLJIT_MEM1(SLJIT_SP), common->mark_ptr, TMP2, 0);
    OP1(SLJIT_MOV, SLJIT_MEM1(TMP1), SLJIT_OFFSETOF(jit_arguments, mark_ptr), TMP2, 0);
    if (common->has_skip_arg)
      {
      OP1(SLJIT_MOV, TMP1, 0, SLJIT_MEM1(SLJIT_SP), common->control_head_ptr);
      OP1(SLJIT_MOV, SLJIT_MEM1(SLJIT_SP), common->control_head_ptr, STACK_TOP, 0);
      OP1(SLJIT_MOV, SLJIT_MEM1(STACK_TOP), STACK(1), SLJIT_IMM, type_mark);
      OP1(SLJIT_MOV, SLJIT_MEM1(STACK_TOP), STACK(2), SLJIT_IMM, (sljit_sw)(cc + 2));
      OP1(SLJIT_MOV, SLJIT_MEM1(STACK_TOP), STACK(3), STR_PTR, 0);
      OP1(SLJIT_MOV, SLJIT_MEM1(STACK_TOP), STACK(0), TMP1, 0);
      }
    cc += 1 + 2 + cc[1];
    break;

    case OP_PRUNE:
    case OP_PRUNE_ARG:
    case OP_SKIP:
    case OP_SKIP_ARG:
    case OP_THEN:
    case OP_THEN_ARG:
    case OP_COMMIT:
    case OP_COMMIT_ARG:
    cc = compile_control_verb_matchingpath(common, cc, parent);
    break;

    case OP_FAIL:
    case OP_ACCEPT:
    case OP_ASSERT_ACCEPT:
    cc = compile_fail_accept_matchingpath(common, cc, parent);
    break;

    case OP_CLOSE:
    cc = compile_close_matchingpath(common, cc);
    break;

    case OP_SKIPZERO:
    cc = bracketend(cc + 1);
    break;

    default:
    SLJIT_UNREACHABLE();
    return;
    }
  if (cc == NULL)
    return;
  }

if (has_then_trap)
  {
  /* Head item on backtrack. */
  PUSH_BACKTRACK_NOVALUE(sizeof(then_trap_backtrack), cc);
  BACKTRACK_AS(then_trap_backtrack)->common.cc = then_trap_opcode;
  BACKTRACK_AS(then_trap_backtrack)->then_trap = common->then_trap;
  common->then_trap = save_then_trap;
  }
SLJIT_ASSERT(cc == ccend);
}